

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::pack_group(CVmPackPos *p,CVmPackArgs *args_main,CVmPackGroup *group,int list_per_iter)

{
  int iVar1;
  wchar_t wVar2;
  undefined8 uVar3;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  CVmPackType t2;
  CVmPackType t;
  int more_1;
  wchar_t c;
  int more;
  ListArgs listargs;
  vm_val_t listval;
  CVmPackArgs *args;
  undefined4 in_stack_fffffffffffffee8;
  wchar_t in_stack_fffffffffffffeec;
  CVmPackType *in_stack_fffffffffffffef0;
  CVmPackType *in_stack_fffffffffffffef8;
  CVmPackPos *in_stack_ffffffffffffff00;
  CVmPackType *in_stack_ffffffffffffff78;
  CVmPackType *in_stack_ffffffffffffff80;
  CVmPackArgs *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_64;
  long local_60 [5];
  undefined1 local_38 [16];
  long *local_28;
  int local_1c;
  long local_18;
  long *local_10;
  
  local_28 = in_RSI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(in_RSI,local_38);
  ListArgs::ListArgs((ListArgs *)in_stack_fffffffffffffef0,
                     (vm_val_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_64 = (**(code **)*local_28)();
  if (local_1c != 0) {
    local_64 = (**(code **)*local_10)();
    local_28 = local_60;
    (**(code **)(*local_10 + 0x18))();
  }
  if (((*(int *)(local_18 + 0x44) == -2) || (*(int *)(local_18 + 0x48) != 0)) && (local_64 == 0)) {
    CVmPackPos::set((CVmPackPos *)in_stack_fffffffffffffef0,
                    (CVmPackPos *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    skip_group((CVmPackPos *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    return;
  }
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = CVmPackPos::more((CVmPackPos *)in_stack_fffffffffffffef0);
        if (iVar1 == 0) {
          return;
        }
        wVar2 = CVmPackPos::getch((CVmPackPos *)in_stack_fffffffffffffef0);
        if ((wVar2 != L'(') && (wVar2 != L'[')) break;
        pack_subgroup((CVmPackPos *)t2._56_8_,(CVmPackArgs *)t2._48_8_,(CVmPackGroup *)t2._40_8_,
                      (CVmPackType *)t2._32_8_);
      }
      if (wVar2 == *(wchar_t *)(local_18 + 8)) break;
      CVmPackType::CVmPackType(in_stack_fffffffffffffef0);
      parse_type(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (CVmPackGroup *)in_stack_fffffffffffffef0);
      wVar2 = CVmPackPos::getch((CVmPackPos *)in_stack_fffffffffffffef0);
      if (wVar2 == L'/') {
        CVmPackPos::inc((CVmPackPos *)in_stack_fffffffffffffef0);
        wVar2 = CVmPackPos::getch((CVmPackPos *)in_stack_fffffffffffffef0);
        if ((wVar2 == L'(') || (wVar2 == L'[')) {
          pack_subgroup((CVmPackPos *)t2._56_8_,(CVmPackArgs *)t2._48_8_,(CVmPackGroup *)t2._40_8_,
                        (CVmPackType *)t2._32_8_);
        }
        else {
          CVmPackType::CVmPackType(in_stack_fffffffffffffef0);
          parse_type(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (CVmPackGroup *)in_stack_fffffffffffffef0);
          pack_item((CVmPackGroup *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
      }
      else {
        pack_item((CVmPackGroup *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
    in_stack_ffffffffffffff94 = (**(code **)*local_28)();
    if (local_1c != 0) {
      in_stack_ffffffffffffff94 = (**(code **)*local_10)();
      (**(code **)(*local_10 + 0x10))(local_10,local_38);
      ListArgs::set((ListArgs *)in_stack_fffffffffffffef0,
                    (vm_val_t *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      (**(code **)(*local_10 + 0x18))();
    }
    if (*(int *)(local_18 + 0x44) == -2) {
      if (in_stack_ffffffffffffff94 == 0) break;
    }
    else if (*(int *)(local_18 + 0x44) <= *(int *)(local_18 + 0x40)) break;
    if ((*(int *)(local_18 + 0x48) != 0) && (in_stack_ffffffffffffff94 == 0)) break;
    *(int *)(local_18 + 0x40) = *(int *)(local_18 + 0x40) + 1;
    uVar3 = (**(code **)(**(long **)(local_18 + 0x30) + 0x38))();
    *(undefined8 *)(local_18 + 0x38) = uVar3;
    CVmPackPos::set((CVmPackPos *)in_stack_fffffffffffffef0,
                    (CVmPackPos *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if (*(int *)(local_18 + 0x48) == 0) {
    return;
  }
  if (local_1c != 0) {
    while (iVar1 = (**(code **)*local_10)(), iVar1 != 0) {
      (**(code **)(*local_10 + 0x18))();
    }
    return;
  }
  while (iVar1 = (**(code **)*local_28)(), iVar1 != 0) {
    (**(code **)(*local_28 + 0x18))();
  }
  return;
}

Assistant:

void CVmPack::pack_group(VMG_ CVmPackPos *p, CVmPackArgs *args_main,
                         CVmPackGroup *group, int list_per_iter)
{
    /* assume we're unpacking from the main argument list */
    CVmPackArgs *args = args_main;
    
    /* 
     *   if there's a list per group iteration, the next argument should be a
     *   list from which we'll take arguments for this single iteration 
     */
    vm_val_t listval;
    ListArgs listargs(vmg_ args->get(&listval));
    int more = args->more();
    if (list_per_iter)
    {
        /* pull out and switch to the sublist for the first iteration */
        more = args_main->more();
        args = &listargs;
        args_main->next();
    }

    /* 
     *   if this is an up-to count, and the source list is empty, packing
     *   zero iterations is valid 
     */
    if ((group->num_iters == ITER_STAR || group->up_to_iters) && !more)
    {
        /* skip the group in the source */
        p->set(&group->start);
        skip_group(p, group->close_paren);

        /* we're done */
        return;
    }

    /* run through the format list */
    while (p->more())
    {
        /* check for group entry/exit */
        wchar_t c = p->getch();
        if (c == '(' || c == '[')
        {
            /* start of a group - pack the sub-group */
            pack_subgroup(vmg_ p, args, group, 0);
        }
        else if (c == group->close_paren)
        {
            /* 
             *   if we're reading arguments from a separate sublist per
             *   iteration of the group, move on to the next sublist 
             */
            int more = args->more();
            if (list_per_iter)
            {
                /* switch to the next sublist from the main arguments */
                more = args_main->more();
                listargs.set(vmg_ args_main->get(&listval));
                args_main->next();
            }

            /* 
             *   Determine if we're done.  If the group has a '*' repeat
             *   count, we're done when we're out of arguments.  If it has an
             *   up-to count, we're done if we're either out of arguments or
             *   at the iteration count limit.  Otherwise, we're done when
             *   we've reached the iteration count limit.
             */
            if ((group->num_iters == ITER_STAR
                 ? !more
                 : group->cur_iter >= group->num_iters)
                || (group->up_to_iters && !more))
            {
                /* 
                 *   if this is an up-to count, make sure we consumed all
                 *   arguments 
                 */
                if (group->up_to_iters)
                {
                    if (list_per_iter)
                        for ( ; args_main->more() ; args_main->next()) ;
                    else
                        for ( ; args->more() ; args->next()) ;
                }
                
                /* done */
                return;
            }

            /* 
             *   We're going back for another iteration of the group.
             *   Increment the iteration count, and go back to the start of
             *   the group in the template string.  
             */
            group->cur_iter++;
            group->stream_ofs = group->ds->get_pos();
            p->set(&group->start);
        }
        else
        {
            /* 
             *   It's not a group, so it must be a single item.  Parse the
             *   item definition. 
             */
            CVmPackType t;
            parse_type(p, &t, group);

            /* check to see if this is a length prefix to the next item */
            if (p->getch() == '/')
            {
                /* skip the '/' */
                p->inc();

                /* check for a group */
                if ((c = p->getch()) == '(' || c == '[')
                {
                    /* go pack the subgroup with the prefix count */
                    pack_subgroup(vmg_ p, args, group, &t);
                }
                else
                {
                    /* 
                     *   It's not a group, so it must be a single item.
                     *   Parse the item definition. 
                     */
                    CVmPackType t2;
                    parse_type(p, &t2, group);

                    /* pack the item with the count prefix */
                    pack_item(vmg_ group, args, &t2, &t);
                }
            }
            else
            {
                /* there's no count prefix - go pack the single item */
                pack_item(vmg_ group, args, &t, 0);
            }
        }
    }
}